

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  CommandRunner *pCVar1;
  Metrics *this_00;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Metric *pMVar5;
  size_type *psVar6;
  bool bVar7;
  pointer ppNVar8;
  string content;
  string rspfile;
  ScopedMetric metrics_h_scoped;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  ScopedMetric local_40;
  
  if ((StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar3 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric),
     this_00 = g_metrics, iVar3 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar5 = (Metric *)0x0;
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"StartEdge","");
      pMVar5 = Metrics::NewMetric(this_00,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    StartEdge::metrics_h_metric = pMVar5;
    __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,StartEdge::metrics_h_metric);
  bVar2 = Edge::is_phony(edge);
  bVar7 = true;
  if (bVar2) goto LAB_0010de62;
  BuildStatus::BuildEdgeStarted(this->status_,edge);
  for (ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar8 !=
      (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar8 = ppNVar8 + 1) {
    bVar2 = DiskInterface::MakeDirs(this->disk_interface_,&(*ppNVar8)->path_);
    if (!bVar2) {
      bVar7 = false;
      goto LAB_0010de62;
    }
  }
  Edge::GetUnescapedRspfile_abi_cxx11_(&local_a0,edge);
  if (local_a0._M_string_length == 0) {
LAB_0010dcf9:
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    iVar3 = (*pCVar1->_vptr_CommandRunner[3])(pCVar1,edge);
    bVar7 = true;
    if ((char)iVar3 == '\0') {
      Edge::EvaluateCommand_abi_cxx11_(&local_60,edge,false);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x126665);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_e0.field_2._M_allocated_capacity = *psVar6;
        local_e0.field_2._8_8_ = plVar4[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar6;
        local_e0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_c0.field_2._M_allocated_capacity = *psVar6;
        local_c0.field_2._8_8_ = plVar4[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar6;
        local_c0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_c0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0010de45;
    }
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"rspfile_content","");
    Edge::GetBinding(&local_c0,edge,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    iVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                      (this->disk_interface_,&local_a0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((char)iVar3 != '\0') goto LAB_0010dcf9;
LAB_0010de45:
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
LAB_0010de62:
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar7;
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  status_->BuildEdgeStarted(edge);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}